

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseResolver<std::vector<int,_std::allocator<int>_>_>::PromiseResolver
          (PromiseResolver<std::vector<int,_std::allocator<int>_>_> *this,
          QPromise<std::vector<int,_std::allocator<int>_>_> *promise)

{
  Data *pDVar1;
  QPromise<std::vector<int,_std::allocator<int>_>_> *pQVar2;
  
  pDVar1 = (Data *)operator_new(0x10);
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar1->promise = (QPromise<std::vector<int,_std::allocator<int>_>_> *)0x0;
  (this->m_d).d = pDVar1;
  LOCK();
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar2 = (QPromise<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x10);
  (pQVar2->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>)._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00155c68;
  (pQVar2->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d.d =
       (PromiseData<std::vector<int,_std::allocator<int>_>_> *)0x0;
  (pQVar2->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d.d =
       (promise->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d.d;
  (promise->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>).m_d.d =
       (PromiseData<std::vector<int,_std::allocator<int>_>_> *)0x0;
  (pQVar2->super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>)._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00155c20;
  ((this->m_d).d)->promise = pQVar2;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }